

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

void on_read(uv_stream_t *pipe,ssize_t nread,uv_buf_t *rdbuf)

{
  int iVar1;
  char *pcVar2;
  uv_write_t *req;
  undefined8 uVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  size_t local_10;
  
  local_10 = eval_a;
  if (nread != -0xfff && nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
            ,0x66,"nread > 0 || nread == UV_EOF");
    abort();
  }
  if (0 < nread) {
    output_used = (int)nread + output_used;
    if (output_used % 0xc == 0) {
      iVar1 = memcmp("hello world\n",output,0xc);
      pcVar2 = (char *)(long)iVar1;
      eval_a = (int64_t)pcVar2;
      if (pcVar2 == (char *)0x0) {
        _eval_a = uv_buf_init(output,0xc);
        req = (uv_write_t *)malloc(200);
        iVar1 = uv_write(req,(uv_stream_t *)&in,(uv_buf_t *)&eval_a,1,after_write);
        pcVar2 = (char *)(long)iVar1;
        if (pcVar2 == (char *)0x0) goto LAB_0017bba6;
        pcVar4 = "r";
        uVar3 = 0x6f;
      }
      else {
        pcVar4 = "memcmp(\"hello world\\n\", output, 12)";
        uVar3 = 0x6b;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-stdio-over-pipes.c"
              ,uVar3,pcVar4,"==","0",pcVar2,"==",0);
      abort();
    }
  }
LAB_0017bba6:
  on_read_cb_called = on_read_cb_called + 1;
  return;
}

Assistant:

static void on_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  if (nread > 0) {
    output_used += nread;
  } else if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);
    uv_close((uv_handle_t*) tcp, close_cb);
  }
}